

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O2

void __thiscall icu_63::ICUCollatorFactory::~ICUCollatorFactory(ICUCollatorFactory *this)

{
  void *in_RSI;
  
  ICUResourceBundleFactory::~ICUResourceBundleFactory(&this->super_ICUResourceBundleFactory);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

UObject*
ICUCollatorFactory::create(const ICUServiceKey& key, const ICUService* /* service */, UErrorCode& status) const {
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        Locale loc;
        // make sure the requested locale is correct
        // default LocaleFactory uses currentLocale since that's the one vetted by handlesKey
        // but for ICU rb resources we use the actual one since it will fallback again
        lkey.canonicalLocale(loc);
        
        return Collator::makeInstance(loc, status);
    }
    return NULL;
}